

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O2

void QDBusPlatformMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  Data *pDVar2;
  Data *pDVar3;
  DataPointer _t1;
  DataPointer _t2;
  bool bVar4;
  undefined8 *puVar5;
  InterfaceType *pIVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 1) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
      }
      else {
        if (*_a[1] != 1) goto LAB_00597e90;
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
      }
      *puVar5 = pIVar6;
    }
    else {
      puVar5 = (undefined8 *)*_a;
LAB_00597e90:
      *puVar5 = 0;
    }
  }
  else if (_c == IndexOfMethod) {
    bVar4 = QtMocHelpers::indexOfMethod<void(QDBusPlatformMenu::*)(unsigned_int,int)>
                      ((QtMocHelpers *)_a,(void **)updated,0,0);
    if (!bVar4) {
      bVar4 = QtMocHelpers::
              indexOfMethod<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
                        ((QtMocHelpers *)_a,(void **)propertiesUpdated,0,1);
      if (!bVar4) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          QtMocHelpers::indexOfMethod<void(QDBusPlatformMenu::*)(int,unsigned_int)>
                    ((QtMocHelpers *)_a,(void **)popupRequested,0,2);
          return;
        }
        goto LAB_00597f53;
      }
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        popupRequested((QDBusPlatformMenu *)_o,*_a[1],*_a[2]);
        return;
      }
      goto LAB_00597f53;
    }
    if (_id == 1) {
      pDVar2 = ((DataPointer *)_a[1])->d;
      _t2 = *(DataPointer *)_a[1];
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = ((DataPointer *)_a[2])->d;
      _t1 = *(DataPointer *)_a[2];
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      propertiesUpdated((QDBusPlatformMenu *)_o,(QDBusMenuItemList)_t1,(QDBusMenuItemKeysList)_t2);
      QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer
                ((QArrayDataPointer<QDBusMenuItemKeys> *)&stack0xffffffffffffffb8);
      QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
                ((QArrayDataPointer<QDBusMenuItem> *)&stack0xffffffffffffffd0);
    }
    else if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        updated((QDBusPlatformMenu *)_o,*_a[1],*_a[2]);
        return;
      }
      goto LAB_00597f53;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00597f53:
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusPlatformMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->propertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->popupRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(uint , int )>(_a, &QDBusPlatformMenu::updated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(QDBusMenuItemList , QDBusMenuItemKeysList )>(_a, &QDBusPlatformMenu::propertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(int , uint )>(_a, &QDBusPlatformMenu::popupRequested, 2))
            return;
    }
}